

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::avgrUInt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  if (((this->type).id == 2) && ((other->type).id == 2)) {
    (__return_storage_ptr__->field_0).i32 =
         (((this->field_0).i32 + (other->field_0).i32) -
         ((this->field_0).i32 + (other->field_0).i32 + 1 >> 0x1f)) + 1 >> 1;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

Literal Literal::avgrUInt(const Literal& other) const {
  return Literal((geti32() + other.geti32() + 1) / 2);
}